

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O3

JavascriptFunction * __thiscall
Js::JavascriptStackWalker::GetCurrentFunction(JavascriptStackWalker *this,bool includeInlinedFrames)

{
  ushort uVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  JavascriptFunction *pJVar5;
  void **ppvVar6;
  
  uVar1 = *(ushort *)&this->field_0x50;
  if (((uVar1 >> 2 | uVar1) & 1) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                ,0x40b,"(this->IsJavascriptFrame())","this->IsJavascriptFrame()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
    uVar1 = *(ushort *)&this->field_0x50;
  }
  if ((includeInlinedFrames) && ((uVar1 & 1) != 0)) {
    pJVar5 = InlinedFrameWalker::GetFunctionObject(&this->inlinedFrameWalker);
    return pJVar5;
  }
  if ((uVar1 & 8) == 0) {
    ppvVar6 = GetCurrentArgv(this);
    pJVar5 = StackScriptFunction::GetCurrentFunctionObject((JavascriptFunction *)*ppvVar6);
    return pJVar5;
  }
  pJVar5 = VarTo<Js::JavascriptFunction,Js::RecyclableObject>
                     (this->prevNativeLibraryEntry->function);
  return pJVar5;
}

Assistant:

JavascriptFunction * JavascriptStackWalker::GetCurrentFunction(bool includeInlinedFrames /* = true */) const
    {
        Assert(this->IsJavascriptFrame());

#if ENABLE_NATIVE_CODEGEN
        if (includeInlinedFrames && inlinedFramesBeingWalked)
        {
            return inlinedFrameWalker.GetFunctionObject();
        }
        else
#endif
            if (this->isNativeLibraryFrame)
        {
            // Return saved function. Do not read from stack as compiler may stackpack/optimize args.
            return VarTo<JavascriptFunction>(this->prevNativeLibraryEntry->function);
        }
        else
        {
            return StackScriptFunction::GetCurrentFunctionObject((JavascriptFunction *)this->GetCurrentArgv()[JavascriptFunctionArgIndex_Function]);
        }
    }